

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_info.c
# Opt level: O2

void add_role(CHAR_DATA *ch,char *string)

{
  char *str;
  size_t sVar1;
  char *pcVar2;
  char buf [16384];
  char obuf [16384];
  char local_8028 [16384];
  char local_4028 [16392];
  
  str = ctime(&current_time);
  chomp(str);
  pcVar2 = ch->pcdata->role;
  if (pcVar2 == (char *)0x0) {
    local_8028[0] = '\0';
  }
  else {
    strcpy(local_8028,pcVar2);
  }
  sprintf(local_4028,"Role entry added on %s at level %d (%d hours):\n\r",str,
          (ulong)(uint)(int)ch->level,((ch->played + current_time) - ch->logon) / 0xe10 & 0xffffffff
         );
  strcat(local_8028,local_4028);
  strcat(local_8028,string);
  sVar1 = strlen(local_8028);
  (local_8028 + sVar1)[0] = '\n';
  (local_8028 + sVar1)[1] = '\r';
  local_8028[sVar1 + 2] = '\0';
  free_pstring(ch->pcdata->role);
  pcVar2 = palloc_string(local_8028);
  ch->pcdata->role = pcVar2;
  return;
}

Assistant:

void add_role(CHAR_DATA *ch, char *string)
{
	char buf[MAX_BUF], obuf[MAX_BUF];

	auto strtime = ctime(&current_time);
	chomp(strtime);

	if (ch->pcdata->role)
		sprintf(buf, "%s", ch->pcdata->role);
	else
		strcpy(buf, "");

	sprintf(obuf, "Role entry added on %s at level %d (%d hours):\n\r",
		strtime,
		ch->level,
		(int)((ch->played + current_time - ch->logon) / 3600));

	strcat(buf, obuf);
	strcat(buf, string);
	strcat(buf, "\n\r");

	free_pstring(ch->pcdata->role);
	ch->pcdata->role = palloc_string(buf);
}